

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_ar.c
# Opt level: O1

size_t WebRtcSpl_FilterAR(int16_t *a,size_t a_length,int16_t *x,size_t x_length,int16_t *state,
                         size_t state_length,int16_t *state_low,size_t state_low_length,
                         int16_t *filtered,int16_t *filtered_low,size_t filtered_low_length)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  uint uVar5;
  size_t sVar6;
  int iVar7;
  short *psVar8;
  int16_t *piVar9;
  int16_t *piVar10;
  long lVar11;
  ulong uVar12;
  
  if (x_length != 0) {
    piVar9 = filtered_low;
    piVar10 = filtered;
    uVar12 = 0;
    do {
      iVar7 = (int)*x << 0xc;
      uVar1 = uVar12 + 1;
      sVar6 = a_length;
      if (uVar12 < a_length) {
        sVar6 = uVar1;
      }
      if (sVar6 < 2) {
        iVar4 = 0;
        psVar8 = a + 1;
      }
      else {
        iVar4 = 0;
        lVar3 = -1;
        psVar8 = a + 1;
        do {
          iVar7 = iVar7 - (int)piVar10[lVar3] * (int)*psVar8;
          iVar4 = iVar4 - (int)piVar9[lVar3] * (int)*psVar8;
          psVar8 = psVar8 + 1;
          lVar3 = lVar3 + -1;
        } while (-lVar3 != sVar6);
        psVar8 = a + sVar6;
      }
      if (uVar1 < a_length) {
        lVar11 = 1;
        lVar3 = state_length - 1;
        do {
          iVar7 = iVar7 - (int)state[lVar3] * (int)psVar8[lVar11 + -1];
          iVar4 = iVar4 - (int)state_low[lVar3] * (int)psVar8[lVar11 + -1];
          lVar3 = lVar3 + -1;
          lVar2 = lVar11 + uVar12;
          lVar11 = lVar11 + 1;
        } while (lVar2 + 1U < a_length);
      }
      x = x + 1;
      uVar5 = (iVar4 >> 0xc) + iVar7 + 0x800;
      *piVar10 = (int16_t)(uVar5 >> 0xc);
      piVar10 = piVar10 + 1;
      *piVar9 = ((short)iVar7 + (short)(iVar4 >> 0xc)) - ((ushort)uVar5 & 0xf000);
      piVar9 = piVar9 + 1;
      uVar12 = uVar1;
    } while (uVar1 != x_length);
  }
  lVar3 = state_length - x_length;
  if (state_length < x_length || lVar3 == 0) {
    WebRtcSpl_CopyFromEndW16(filtered,x_length,a_length - 1,state);
    WebRtcSpl_CopyFromEndW16(filtered_low,x_length,a_length - 1,state_low);
  }
  else {
    lVar11 = 0;
    sVar6 = x_length;
    do {
      *(int16_t *)((long)state + lVar11) = state[sVar6];
      *(int16_t *)((long)state_low + lVar11) = state_low[sVar6];
      sVar6 = sVar6 + 1;
      lVar11 = lVar11 + 2;
    } while (state_length != sVar6);
    if (x_length != 0) {
      sVar6 = 0;
      do {
        state[lVar3 + sVar6] = filtered[sVar6];
        state[lVar3 + sVar6] = filtered_low[sVar6];
        sVar6 = sVar6 + 1;
      } while (x_length != sVar6);
    }
  }
  return x_length;
}

Assistant:

size_t WebRtcSpl_FilterAR(const int16_t* a,
                          size_t a_length,
                          const int16_t* x,
                          size_t x_length,
                          int16_t* state,
                          size_t state_length,
                          int16_t* state_low,
                          size_t state_low_length,
                          int16_t* filtered,
                          int16_t* filtered_low,
                          size_t filtered_low_length)
{
    int32_t o;
    int32_t oLOW;
    size_t i, j, stop;
    const int16_t* x_ptr = &x[0];
    int16_t* filteredFINAL_ptr = filtered;
    int16_t* filteredFINAL_LOW_ptr = filtered_low;

    for (i = 0; i < x_length; i++)
    {
        // Calculate filtered[i] and filtered_low[i]
        const int16_t* a_ptr = &a[1];
        int16_t* filtered_ptr = &filtered[i - 1];
        int16_t* filtered_low_ptr = &filtered_low[i - 1];
        int16_t* state_ptr = &state[state_length - 1];
        int16_t* state_low_ptr = &state_low[state_length - 1];

        o = (int32_t)(*x_ptr++) << 12;
        oLOW = (int32_t)0;

        stop = (i < a_length) ? i + 1 : a_length;
        for (j = 1; j < stop; j++)
        {
          o -= *a_ptr * *filtered_ptr--;
          oLOW -= *a_ptr++ * *filtered_low_ptr--;
        }
        for (j = i + 1; j < a_length; j++)
        {
          o -= *a_ptr * *state_ptr--;
          oLOW -= *a_ptr++ * *state_low_ptr--;
        }

        o += (oLOW >> 12);
        *filteredFINAL_ptr = (int16_t)((o + (int32_t)2048) >> 12);
        *filteredFINAL_LOW_ptr++ = (int16_t)(o - ((int32_t)(*filteredFINAL_ptr++)
                << 12));
    }

    // Save the filter state
    if (x_length >= state_length)
    {
        WebRtcSpl_CopyFromEndW16(filtered, x_length, a_length - 1, state);
        WebRtcSpl_CopyFromEndW16(filtered_low, x_length, a_length - 1, state_low);
    } else
    {
        for (i = 0; i < state_length - x_length; i++)
        {
            state[i] = state[i + x_length];
            state_low[i] = state_low[i + x_length];
        }
        for (i = 0; i < x_length; i++)
        {
            state[state_length - x_length + i] = filtered[i];
            state[state_length - x_length + i] = filtered_low[i];
        }
    }

    return x_length;
}